

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumTraits.hpp
# Opt level: O0

Option<Kernel::TermSpec> *
Kernel::forAnyNumTraits<Kernel::norm(Kernel::TermSpec,Kernel::AbstractingUnifier&)::__1>
          (anon_class_40_5_fde68545 clsr)

{
  Option<Kernel::TermSpec> *in_RDI;
  Option<Kernel::TermSpec> *t;
  anon_class_40_5_fde68545 local_88;
  undefined1 local_58 [88];
  
  t = (Option<Kernel::TermSpec> *)&stack0x00000008;
  norm(Kernel::TermSpec,Kernel::AbstractingUnifier&)::$_1::operator()
            ((anon_class_40_5_fde68545 *)(local_58 + 0x20));
  norm(Kernel::TermSpec,Kernel::AbstractingUnifier&)::$_1::operator()
            ((anon_class_40_5_fde68545 *)local_58,t);
  Lib::operator||(t,in_RDI);
  norm(Kernel::TermSpec,Kernel::AbstractingUnifier&)::$_1::operator()(&local_88,t);
  Lib::operator||(t,in_RDI);
  Lib::Option<Kernel::TermSpec>::~Option((Option<Kernel::TermSpec> *)0x9bb17f);
  Lib::Option<Kernel::TermSpec>::~Option((Option<Kernel::TermSpec> *)0x9bb18c);
  Lib::Option<Kernel::TermSpec>::~Option((Option<Kernel::TermSpec> *)0x9bb196);
  Lib::Option<Kernel::TermSpec>::~Option((Option<Kernel::TermSpec> *)0x9bb1a0);
  return in_RDI;
}

Assistant:

auto forAnyNumTraits(Clsr clsr) {
  return clsr( IntTraits{}) 
      || clsr( RatTraits{})
      || clsr(RealTraits{});
}